

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O2

void __thiscall rw::Atomic::setGeometry(Atomic *this,Geometry *geo,uint32 flags)

{
  MorphTarget *pMVar1;
  Frame *this_00;
  undefined8 uVar2;
  float32 fVar3;
  
  if (this->geometry != (Geometry *)0x0) {
    Geometry::destroy(this->geometry);
  }
  if (geo != (Geometry *)0x0) {
    geo->refCount = geo->refCount + 1;
  }
  this->geometry = geo;
  if ((flags & 1) == 0 && geo != (Geometry *)0x0) {
    pMVar1 = geo->morphTargets;
    fVar3 = (pMVar1->boundingSphere).center.y;
    uVar2 = *(undefined8 *)&(pMVar1->boundingSphere).center.z;
    (this->boundingSphere).center.x = (pMVar1->boundingSphere).center.x;
    (this->boundingSphere).center.y = fVar3;
    *(undefined8 *)&(this->boundingSphere).center.z = uVar2;
    this_00 = (Frame *)(this->object).object.parent;
    if (this_00 != (Frame *)0x0) {
      Frame::updateObjects(this_00);
      return;
    }
  }
  return;
}

Assistant:

void
Atomic::setGeometry(Geometry *geo, uint32 flags)
{
	if(this->geometry)
		this->geometry->destroy();
	if(geo)
		geo->addRef();
	this->geometry = geo;
	if(flags & SAMEBOUNDINGSPHERE)
		return;
	if(geo){
		this->boundingSphere = geo->morphTargets[0].boundingSphere;
		if(this->getFrame())	// TODO: && getWorld???
			this->getFrame()->updateObjects();
	}
}